

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3b35295::DumpVisitor::onStartCompileUnit(DumpVisitor *this,Unit *CU)

{
  uint64_t uVar1;
  bool IsLittleEndian;
  bool IsLittleEndian_00;
  bool IsLittleEndian_01;
  
  writeInitialLength(&CU->Length,this->OS,
                     ((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.
                     DebugInfo)->IsLittleEndian);
  uVar1 = llvm::raw_ostream::tell(this->OS);
  this->StartPos = uVar1;
  writeInteger<unsigned_short>
            (CU->Version,this->OS,
             ((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo)->
             IsLittleEndian);
  if (4 < CU->Version) {
    writeInteger<unsigned_char>(CU->Type,this->OS,IsLittleEndian);
    writeInteger<unsigned_char>(CU->AddrSize,this->OS,IsLittleEndian_00);
    writeInteger<unsigned_int>
              (CU->AbbrOffset,this->OS,
               ((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo)
               ->IsLittleEndian);
    return;
  }
  writeInteger<unsigned_int>
            (CU->AbbrOffset,this->OS,
             ((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo)->
             IsLittleEndian);
  writeInteger<unsigned_char>(CU->AddrSize,this->OS,IsLittleEndian_01);
  return;
}

Assistant:

void onStartCompileUnit(const DWARFYAML::Unit &CU) override {
    writeInitialLength(CU.Length, OS, DebugInfo.IsLittleEndian);
    StartPos = OS.tell(); // XXX BINARYEN
    writeInteger((uint16_t)CU.Version, OS, DebugInfo.IsLittleEndian);
    if(CU.Version >= 5) {
      writeInteger((uint8_t)CU.Type, OS, DebugInfo.IsLittleEndian);
      writeInteger((uint8_t)CU.AddrSize, OS, DebugInfo.IsLittleEndian);
      writeInteger((uint32_t)CU.AbbrOffset, OS, DebugInfo.IsLittleEndian);
    }else {
      writeInteger((uint32_t)CU.AbbrOffset, OS, DebugInfo.IsLittleEndian);
      writeInteger((uint8_t)CU.AddrSize, OS, DebugInfo.IsLittleEndian);
    }
  }